

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

QString * __thiscall QDir::canonicalPath(QString *__return_storage_ptr__,QDir *this)

{
  QDirPrivate *pQVar1;
  _Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_> _Var2;
  long in_FS_OFFSET;
  QFileSystemEntry answer;
  undefined1 local_30 [16];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d.ptr;
  _Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
       (pQVar1->fileEngine)._M_t.
       super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
       super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
       super__Head_base<0UL,_QAbstractFileEngine_*,_false>;
  if (_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl ==
      (QAbstractFileEngine *)0x0) {
    local_30._0_8_ = &pQVar1->fileCache;
    local_30._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QBasicMutex::lock((QBasicMutex *)local_30._0_8_);
    local_30[8] = true;
    answer._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
    answer.m_nativeFilePath.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    answer.m_nativeFilePath.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    answer.m_filePath.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    answer.m_nativeFilePath.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    answer.m_filePath.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    answer.m_filePath.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QFileSystemEngine::canonicalName(&answer,&pQVar1->dirEntry,&(pQVar1->fileCache).metaData);
    QFileSystemEntry::filePath(__return_storage_ptr__,&answer);
    QFileSystemEntry::~QFileSystemEntry(&answer);
    QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_30);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_00211df6;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
LAB_00211df6:
      __stack_chk_fail();
    }
    (**(code **)(*(long *)_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl +
                200))(__return_storage_ptr__,
                      _Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl,6);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QDir::canonicalPath() const
{
    Q_D(const QDir);
    if (!d->fileEngine) {
        QMutexLocker locker(&d->fileCache.mutex);
        QFileSystemEntry answer =
                QFileSystemEngine::canonicalName(d->dirEntry, d->fileCache.metaData);
        return answer.filePath();
    }
    return d->fileEngine->fileName(QAbstractFileEngine::CanonicalName);
}